

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStore.h
# Opt level: O2

void __thiscall FIX::FileStoreFactory::~FileStoreFactory(FileStoreFactory *this)

{
  *(code **)this = __cxa_finalize;
  SessionSettings::~SessionSettings((SessionSettings *)(this + 0x28));
  std::__cxx11::string::~string((string *)(this + 8));
  return;
}

Assistant:

FileStoreFactory( const SessionSettings& settings )
: m_settings( settings ) {}